

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okiadpcm.c
# Opt level: O1

void oki_adpcm_init(oki_adpcm_state *adpcm,INT8 *custom_index_shift,INT16 *custom_diff_lookup)

{
  int iVar1;
  int iVar2;
  INT8 *pIVar3;
  int iVar4;
  long lVar5;
  INT16 *pIVar6;
  long lVar7;
  double dVar8;
  
  pIVar3 = s_index_shift;
  if (custom_index_shift != (INT8 *)0x0) {
    pIVar3 = custom_index_shift;
  }
  adpcm->index_shift = pIVar3;
  if (custom_diff_lookup == (INT16 *)0x0) {
    if (s_tables_computed == '\0') {
      s_tables_computed = '\x01';
      custom_diff_lookup = s_diff_lookup;
      lVar7 = 0;
      pIVar6 = s_diff_lookup;
      do {
        dVar8 = pow(1.1,(double)(int)lVar7);
        dVar8 = floor(dVar8 * 16.0);
        iVar2 = (int)dVar8;
        iVar4 = iVar2 + 7;
        iVar1 = iVar2 + 3;
        if (-1 < iVar2) {
          iVar4 = iVar2;
          iVar1 = iVar2;
        }
        lVar5 = 0;
        do {
          pIVar6[lVar5] =
               ((short)(char)(&DAT_0017ecc3)[lVar5 * 4] * (short)(iVar1 >> 2) +
                (short)(char)(&DAT_0017ecc2)[lVar5 * 4] * (short)(iVar2 / 2) +
               (short)(char)(&DAT_0017ecc1)[lVar5 * 4] * (short)iVar2 + (short)(iVar4 >> 3)) *
               (short)(char)(&compute_tables_nbl2bit)[lVar5 * 4];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x10);
        lVar7 = lVar7 + 1;
        pIVar6 = pIVar6 + 0x10;
      } while (lVar7 != 0x31);
    }
    else {
      custom_diff_lookup = s_diff_lookup;
    }
  }
  adpcm->diff_lookup = custom_diff_lookup;
  adpcm->signal = -2;
  adpcm->step = 0;
  return;
}

Assistant:

void oki_adpcm_init(oki_adpcm_state* adpcm, const INT8* custom_index_shift, const INT16* custom_diff_lookup)
{
	adpcm->index_shift =  (custom_index_shift != NULL) ? custom_index_shift : s_index_shift;
	if (custom_diff_lookup != NULL)
	{
		adpcm->diff_lookup = custom_diff_lookup;
	}
	else
	{
		compute_tables();
		adpcm->diff_lookup = s_diff_lookup;
	}
	oki_adpcm_reset(adpcm);
	
	return;
}